

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O0

string * __thiscall
toml::detail::character_either::expected_chars_abi_cxx11_(character_either *this,location *param_2)

{
  size_type sVar1;
  size_type sVar2;
  long in_RSI;
  string *in_RDI;
  size_t i;
  string *expected;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  ulong uVar3;
  string *__lhs;
  int in_stack_ffffffffffffff1c;
  undefined8 local_d8;
  
  __lhs = in_RDI;
  std::__cxx11::string::string(in_stack_fffffffffffffed0);
  sVar1 = CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RSI + 8));
  if (sVar1 == 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffec0,
               (size_type)in_stack_fffffffffffffeb8);
    show_char_abi_cxx11_(in_stack_ffffffffffffff1c);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::__cxx11::string::~string(in_stack_fffffffffffffec0);
  }
  else {
    sVar1 = CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RSI + 8));
    if (sVar1 == 2) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffec0,
                 (size_type)in_stack_fffffffffffffeb8);
      show_char_abi_cxx11_(in_stack_ffffffffffffff1c);
      std::operator+(in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffec0,
                 (size_type)in_stack_fffffffffffffeb8);
      show_char_abi_cxx11_(in_stack_ffffffffffffff1c);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      std::__cxx11::string::~string(in_stack_fffffffffffffec0);
      std::__cxx11::string::~string(in_stack_fffffffffffffec0);
      std::__cxx11::string::~string(in_stack_fffffffffffffec0);
      std::__cxx11::string::~string(in_stack_fffffffffffffec0);
    }
    else {
      local_d8 = 0;
      while (uVar3 = local_d8,
            sVar1 = CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RSI + 8)
                              ), uVar3 < sVar1) {
        if (local_d8 != 0) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
        }
        sVar1 = local_d8 + 1;
        sVar2 = CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RSI + 8));
        if (sVar1 == sVar2) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
        }
        in_stack_fffffffffffffec0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
        show_char_abi_cxx11_(in_stack_ffffffffffffff1c);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        std::__cxx11::string::~string(in_stack_fffffffffffffec0);
        local_d8 = local_d8 + 1;
      }
    }
  }
  return __lhs;
}

Assistant:

TOML11_INLINE std::string character_either::expected_chars(location&) const
{
    assert( ! chars_.empty());

    std::string expected;
    if(chars_.size() == 1)
    {
        expected += show_char(chars_.at(0));
    }
    else if(chars_.size() == 2)
    {
        expected += show_char(chars_.at(0)) + " or " + show_char(chars_.at(1));
    }
    else
    {
        for(std::size_t i=0; i<chars_.size(); ++i)
        {
            if(i != 0)
            {
                expected += ", ";
            }
            if(i + 1 == chars_.size())
            {
                expected += "or ";
            }
            expected += show_char(chars_.at(i));
        }
    }
    return expected;
}